

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

void __thiscall BanMan::DumpBanlist(BanMan *this)

{
  long lVar1;
  string_view logging_function;
  int iVar2;
  size_t sVar3;
  type flag;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  Level in_stack_00000070;
  unsigned_long *in_stack_00000080;
  time_point start;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  banmap_t banmap;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  *in_stack_fffffffffffffed0;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  BanMan *in_stack_ffffffffffffff58;
  ConstevalFormatString<2U> in_stack_ffffffffffffff78;
  string_view in_stack_ffffffffffffff80;
  banmap_t *in_stack_ffffffffffffff98;
  CBanDB *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((DumpBanlist()::dump_mutex == '\0') &&
     (iVar2 = __cxa_guard_acquire(&DumpBanlist()::dump_mutex), iVar2 != 0)) {
    __cxa_atexit(AnnotatedMixin<std::mutex>::~AnnotatedMixin,&DumpBanlist::dump_mutex,&__dso_handle)
    ;
    __cxa_guard_release(&DumpBanlist()::dump_mutex);
  }
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),in_stack_ffffffffffffff00
             ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             SUB41((uint)in_stack_fffffffffffffee8 >> 0x18,0));
  std::
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::map((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
         *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),in_stack_ffffffffffffff00
             ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             SUB41((uint)in_stack_fffffffffffffee8 >> 0x18,0));
  SweepBanned(in_stack_ffffffffffffff58);
  bVar4 = (*(byte *)(in_RDI + 0x58) & 1) != 0;
  if (bVar4) {
    std::
    map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
    ::operator=((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                 *)in_stack_fffffffffffffed8.__r,in_stack_fffffffffffffed0);
    *(undefined1 *)(in_RDI + 0x58) = 0;
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if (bVar4) {
    sVar3 = std::chrono::_V2::steady_clock::now();
    bVar4 = CBanDB::Write(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar4) {
      MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffeec,SUB41((uint)in_stack_fffffffffffffee8 >> 0x18,0));
      *(undefined1 *)(in_RDI + 0x58) = 1;
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
    bVar4 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),Trace)
    ;
    if (bVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee0);
      iVar2 = 0;
      std::
      map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
      ::size((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
              *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::chrono::_V2::steady_clock::now();
      flag = std::chrono::operator-
                       ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffffed0,
                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      Ticks<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (in_stack_fffffffffffffed8);
      in_stack_fffffffffffffec8 = 1;
      logging_function._M_str = (char *)in_stack_ffffffffffffff98;
      logging_function._M_len = sVar3;
      LogPrintFormatInternal<unsigned_long,long>
                (logging_function,in_stack_ffffffffffffff80,iVar2,flag.__r,in_stack_00000070,
                 in_stack_ffffffffffffff78,in_stack_00000080,(long *)this);
    }
  }
  std::
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::~map((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
          *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BanMan::DumpBanlist()
{
    static Mutex dump_mutex;
    LOCK(dump_mutex);

    banmap_t banmap;
    {
        LOCK(m_banned_mutex);
        SweepBanned();
        if (!m_is_dirty) return;
        banmap = m_banned;
        m_is_dirty = false;
    }

    const auto start{SteadyClock::now()};
    if (!m_ban_db.Write(banmap)) {
        LOCK(m_banned_mutex);
        m_is_dirty = true;
    }

    LogDebug(BCLog::NET, "Flushed %d banned node addresses/subnets to disk  %dms\n", banmap.size(),
             Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
}